

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printCurrentTestEnded(TestOutput *this,TestResult *res)

{
  long lVar1;
  TestResult *in_RSI;
  long *in_RDI;
  
  if ((*(byte *)((long)in_RDI + 0xc) & 1) == 0) {
    (**(code **)(*in_RDI + 0xa0))();
  }
  else {
    (**(code **)(*in_RDI + 0x58))(in_RDI," - ");
    lVar1 = TestResult::getCurrentTestTotalExecutionTime(in_RSI);
    (**(code **)(*in_RDI + 0x60))(in_RDI,lVar1);
    (**(code **)(*in_RDI + 0x58))(in_RDI," ms\n");
  }
  return;
}

Assistant:

void TestOutput::printCurrentTestEnded(const TestResult& res)
{
    if (verbose_) {
        print(" - ");
        print(res.getCurrentTestTotalExecutionTime());
        print(" ms\n");
    }
    else {
        printProgressIndicator();
    }
}